

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O2

void __thiscall FThinkerList::AddTail(FThinkerList *this,DThinker *thinker)

{
  uint uVar1;
  DThinker *this_00;
  DThinker *pDVar2;
  char *__assertion;
  
  if ((thinker->PrevThinker == (DThinker *)0x0) && (thinker->NextThinker == (DThinker *)0x0)) {
    if (((thinker->super_DObject).ObjectFlags & 0x20) == 0) {
      this_00 = this->Sentinel;
      if (this_00 == (DThinker *)0x0) {
        pDVar2 = thinker;
        this_00 = (DThinker *)DObject::operator_new(0x38);
        DThinker::DThinker(this_00,(no_link_type)pDVar2);
        this->Sentinel = this_00;
        uVar1 = (this_00->super_DObject).ObjectFlags;
        (this_00->super_DObject).ObjectFlags = uVar1 | 0x400;
        this_00->NextThinker = this_00;
        this_00->PrevThinker = this_00;
        if ((uVar1 & 3) != 0 && GC::State == 1) {
          GC::Barrier((DObject *)0x0,(DObject *)this_00);
          this_00 = this->Sentinel;
        }
      }
      pDVar2 = this_00->PrevThinker;
      if (pDVar2->NextThinker == this_00) {
        thinker->PrevThinker = pDVar2;
        thinker->NextThinker = this_00;
        pDVar2->NextThinker = thinker;
        this_00->PrevThinker = thinker;
        GC::WriteBarrier(&thinker->super_DObject,&pDVar2->super_DObject);
        GC::WriteBarrier(&thinker->super_DObject,&this->Sentinel->super_DObject);
        GC::WriteBarrier(&pDVar2->super_DObject,&thinker->super_DObject);
        GC::WriteBarrier(&this->Sentinel->super_DObject,&thinker->super_DObject);
        return;
      }
      __assertion = "tail->NextThinker == Sentinel";
      uVar1 = 0x4e;
    }
    else {
      __assertion = "!(thinker->ObjectFlags & OF_EuthanizeMe)";
      uVar1 = 0x44;
    }
  }
  else {
    __assertion = "thinker->PrevThinker == NULL && thinker->NextThinker == NULL";
    uVar1 = 0x43;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,uVar1,"void FThinkerList::AddTail(DThinker *)");
}

Assistant:

void FThinkerList::AddTail(DThinker *thinker)
{
	assert(thinker->PrevThinker == NULL && thinker->NextThinker == NULL);
	assert(!(thinker->ObjectFlags & OF_EuthanizeMe));
	if (Sentinel == NULL)
	{
		Sentinel = new DThinker(DThinker::NO_LINK);
		Sentinel->ObjectFlags |= OF_Sentinel;
		Sentinel->NextThinker = Sentinel;
		Sentinel->PrevThinker = Sentinel;
		GC::WriteBarrier(Sentinel);
	}
	DThinker *tail = Sentinel->PrevThinker;
	assert(tail->NextThinker == Sentinel);
	thinker->PrevThinker = tail;
	thinker->NextThinker = Sentinel;
	tail->NextThinker = thinker;
	Sentinel->PrevThinker = thinker;
	GC::WriteBarrier(thinker, tail);
	GC::WriteBarrier(thinker, Sentinel);
	GC::WriteBarrier(tail, thinker);
	GC::WriteBarrier(Sentinel, thinker);
}